

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_it_rec_dc_ssse3_intr.c
# Opt level: O2

void ihevcd_itrans_recon_dc_chroma_ssse3
               (UWORD8 *pu1_pred,UWORD8 *pu1_dst,WORD32 pred_strd,WORD32 dst_strd,
               WORD32 log2_trans_size,WORD16 i2_coeff_value)

{
  UWORD8 *pUVar1;
  ulong uVar2;
  undefined8 uVar3;
  char cVar4;
  byte bVar12;
  undefined2 uVar13;
  undefined3 uVar14;
  undefined1 auVar15 [12];
  undefined4 uVar16;
  undefined1 auVar17 [12];
  undefined5 uVar18;
  undefined6 uVar19;
  undefined7 uVar20;
  long lVar21;
  WORD32 i;
  int iVar22;
  int iVar23;
  undefined6 in_register_0000008a;
  int iVar24;
  int iVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  short sVar30;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar46;
  undefined4 uVar45;
  short sVar47;
  undefined1 in_XMM1 [16];
  undefined1 auVar31 [16];
  undefined1 auVar39 [16];
  short sVar48;
  undefined1 auVar40 [16];
  short sVar49;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  undefined1 auVar50 [16];
  short sVar71;
  undefined1 auVar58 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  short sVar75;
  undefined1 auVar74 [16];
  short sVar76;
  short sVar77;
  short sVar80;
  short sVar81;
  short sVar82;
  short sVar83;
  short sVar84;
  short sVar85;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  short sVar86;
  short sVar87;
  short sVar96;
  short sVar97;
  short sVar98;
  short sVar99;
  undefined1 auVar88 [12];
  short sVar100;
  short sVar101;
  undefined1 auVar89 [16];
  undefined1 auVar95 [16];
  short sVar102;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  
  auVar39 = _DAT_0016b4a0;
  iVar24 = 1 << ((byte)log2_trans_size & 0x1f);
  auVar26 = ZEXT416(((int)CONCAT62(in_register_0000008a,i2_coeff_value) * 0x40 + 0x40U >> 1) + 0x800
                    >> 0xc);
  auVar26 = pshuflw(auVar26,auVar26,0);
  sVar70 = auVar26._0_2_;
  sVar71 = auVar26._2_2_;
  if (log2_trans_size == 2) {
    uVar2 = *(ulong *)pu1_pred;
    lVar21 = (long)pred_strd;
    uVar3 = *(undefined8 *)(pu1_pred + lVar21);
    auVar38._8_6_ = 0;
    auVar38._0_8_ = uVar2;
    auVar38[0xe] = (char)(uVar2 >> 0x38);
    auVar38[0xf] = (char)((ulong)uVar3 >> 0x38);
    auVar37._14_2_ = auVar38._14_2_;
    auVar37._8_5_ = 0;
    auVar37._0_8_ = uVar2;
    auVar37[0xd] = (char)((ulong)uVar3 >> 0x30);
    auVar36._13_3_ = auVar37._13_3_;
    auVar36._8_4_ = 0;
    auVar36._0_8_ = uVar2;
    auVar36[0xc] = (char)(uVar2 >> 0x30);
    auVar35._12_4_ = auVar36._12_4_;
    auVar35._8_3_ = 0;
    auVar35._0_8_ = uVar2;
    auVar35[0xb] = (char)((ulong)uVar3 >> 0x28);
    auVar34._11_5_ = auVar35._11_5_;
    auVar34._8_2_ = 0;
    auVar34._0_8_ = uVar2;
    auVar34[10] = (char)(uVar2 >> 0x28);
    auVar33._10_6_ = auVar34._10_6_;
    auVar33[8] = 0;
    auVar33._0_8_ = uVar2;
    auVar33[9] = (char)((ulong)uVar3 >> 0x20);
    auVar32._9_7_ = auVar33._9_7_;
    auVar32[8] = (char)(uVar2 >> 0x20);
    auVar32._0_8_ = uVar2;
    auVar31._8_8_ = auVar32._8_8_;
    auVar31[7] = (char)((ulong)uVar3 >> 0x18);
    auVar31[6] = (char)(uVar2 >> 0x18);
    auVar31[5] = (char)((ulong)uVar3 >> 0x10);
    auVar31[4] = (char)(uVar2 >> 0x10);
    auVar31[3] = (char)((ulong)uVar3 >> 8);
    auVar31[2] = (char)(uVar2 >> 8);
    auVar31[0] = (undefined1)uVar2;
    auVar31[1] = (char)uVar3;
    uVar2 = *(ulong *)(pu1_pred + lVar21 * 2);
    uVar3 = *(undefined8 *)(pu1_pred + lVar21 * 3);
    auVar57._8_6_ = 0;
    auVar57._0_8_ = uVar2;
    auVar57[0xe] = (char)(uVar2 >> 0x38);
    auVar57[0xf] = (char)((ulong)uVar3 >> 0x38);
    auVar56._14_2_ = auVar57._14_2_;
    auVar56._8_5_ = 0;
    auVar56._0_8_ = uVar2;
    auVar56[0xd] = (char)((ulong)uVar3 >> 0x30);
    auVar55._13_3_ = auVar56._13_3_;
    auVar55._8_4_ = 0;
    auVar55._0_8_ = uVar2;
    auVar55[0xc] = (char)(uVar2 >> 0x30);
    auVar54._12_4_ = auVar55._12_4_;
    auVar54._8_3_ = 0;
    auVar54._0_8_ = uVar2;
    auVar54[0xb] = (char)((ulong)uVar3 >> 0x28);
    auVar53._11_5_ = auVar54._11_5_;
    auVar53._8_2_ = 0;
    auVar53._0_8_ = uVar2;
    auVar53[10] = (char)(uVar2 >> 0x28);
    auVar52._10_6_ = auVar53._10_6_;
    auVar52[8] = 0;
    auVar52._0_8_ = uVar2;
    auVar52[9] = (char)((ulong)uVar3 >> 0x20);
    auVar51._9_7_ = auVar52._9_7_;
    auVar51[8] = (char)(uVar2 >> 0x20);
    auVar51._0_8_ = uVar2;
    auVar50._8_8_ = auVar51._8_8_;
    auVar50[7] = (char)((ulong)uVar3 >> 0x18);
    auVar50[6] = (char)(uVar2 >> 0x18);
    auVar50[5] = (char)((ulong)uVar3 >> 0x10);
    auVar50[4] = (char)(uVar2 >> 0x10);
    auVar50[3] = (char)((ulong)uVar3 >> 8);
    auVar50[2] = (char)(uVar2 >> 8);
    auVar50[0] = (undefined1)uVar2;
    auVar50[1] = (char)uVar3;
    auVar39 = pshufb(auVar31,_DAT_0016b4b0);
    auVar26 = pshufb(auVar50,_DAT_0016b4b0);
    sVar30 = auVar39._0_2_ + sVar70;
    sVar41 = auVar39._2_2_ + sVar71;
    sVar42 = auVar39._4_2_ + sVar70;
    sVar43 = auVar39._6_2_ + sVar71;
    sVar44 = auVar39._8_2_ + sVar70;
    sVar46 = auVar39._10_2_ + sVar71;
    sVar47 = auVar39._12_2_ + sVar70;
    sVar48 = auVar39._14_2_ + sVar71;
    sVar49 = auVar26._0_2_ + sVar70;
    sVar65 = auVar26._2_2_ + sVar71;
    sVar66 = auVar26._4_2_ + sVar70;
    sVar67 = auVar26._6_2_ + sVar71;
    sVar68 = auVar26._8_2_ + sVar70;
    sVar69 = auVar26._10_2_ + sVar71;
    sVar70 = auVar26._12_2_ + sVar70;
    sVar71 = auVar26._14_2_ + sVar71;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = *(ulong *)pu1_dst;
    lVar21 = (long)dst_strd;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = *(ulong *)(pu1_dst + lVar21);
    auVar73._8_8_ = 0;
    auVar73._0_8_ = *(ulong *)(pu1_dst + lVar21 * 2);
    uVar3 = *(undefined8 *)(pu1_dst + lVar21 * 3);
    cVar4 = (0 < sVar44) * (sVar44 < 0x100) * (char)sVar44 - (0xff < sVar44);
    cVar5 = (0 < sVar46) * (sVar46 < 0x100) * (char)sVar46 - (0xff < sVar46);
    cVar6 = (0 < sVar47) * (sVar47 < 0x100) * (char)sVar47 - (0xff < sVar47);
    cVar7 = (0 < sVar48) * (sVar48 < 0x100) * (char)sVar48 - (0xff < sVar48);
    cVar8 = (0 < sVar49) * (sVar49 < 0x100) * (char)sVar49 - (0xff < sVar49);
    uVar13 = CONCAT11(cVar8,cVar7);
    cVar9 = (0 < sVar65) * (sVar65 < 0x100) * (char)sVar65 - (0xff < sVar65);
    uVar14 = CONCAT12(cVar9,uVar13);
    cVar10 = (0 < sVar66) * (sVar66 < 0x100) * (char)sVar66 - (0xff < sVar66);
    uVar16 = CONCAT13(cVar10,uVar14);
    cVar11 = (0 < sVar67) * (sVar67 < 0x100) * (char)sVar67 - (0xff < sVar67);
    uVar18 = CONCAT14(cVar11,uVar16);
    uVar19 = CONCAT15((0 < sVar68) * (sVar68 < 0x100) * (char)sVar68 - (0xff < sVar68),uVar18);
    uVar20 = CONCAT16((0 < sVar69) * (sVar69 < 0x100) * (char)sVar69 - (0xff < sVar69),uVar19);
    auVar78 = ZEXT416(0x7050301);
    auVar26 = pshufb(auVar26,auVar78);
    uVar45 = (undefined4)((uint5)uVar18 >> 8);
    uVar2 = CONCAT44(uVar45,uVar45);
    auVar88._8_4_ = 0;
    auVar88._0_8_ = uVar2;
    auVar88 = auVar88 << 0x20;
    auVar39._8_4_ =
         (int)(CONCAT18((0 < sVar71) * (sVar71 < 0x100) * (char)sVar71 - (0xff < sVar71),
                        CONCAT17((0 < sVar70) * (sVar70 < 0x100) * (char)sVar70 - (0xff < sVar70),
                                 uVar20)) >> 0x28);
    auVar39._0_8_ = uVar2;
    auVar39._12_4_ = 0;
    auVar40._8_8_ =
         (undefined8)
         (CONCAT72((int7)(CONCAT63((int6)(CONCAT54((int5)(CONCAT45((int)(CONCAT36((int3)(CONCAT27((
                                                  short)(CONCAT18(auVar26[7],CONCAT17(cVar7,uVar20))
                                                        >> 0x38),CONCAT16(auVar26[6],uVar19)) >>
                                                  0x30),CONCAT15(cVar6,uVar18)) >> 0x28),
                                                  CONCAT14(auVar26[5],uVar16)) >> 0x20),
                                                  CONCAT13(cVar5,uVar14)) >> 0x18),
                                   CONCAT12(auVar26[4],uVar13)) >> 0x10),CONCAT11(cVar4,cVar7)) >> 8
         );
    auVar40[7] = auVar26[3];
    auVar40[6] = (0 < sVar43) * (sVar43 < 0x100) * (char)sVar43 - (0xff < sVar43);
    auVar40[5] = auVar26[2];
    auVar40[4] = (0 < sVar42) * (sVar42 < 0x100) * (char)sVar42 - (0xff < sVar42);
    auVar40[3] = auVar26[1];
    auVar40[2] = (0 < sVar41) * (sVar41 < 0x100) * (char)sVar41 - (0xff < sVar41);
    auVar40[1] = auVar26[0];
    auVar40[0] = (0 < sVar30) * (sVar30 < 0x100) * (char)sVar30 - (0xff < sVar30);
    auVar26 = pshufb(auVar72,auVar78);
    auVar94._0_14_ = SUB1614(auVar39 << 0x20,0);
    auVar94[0xe] = cVar11;
    auVar94[0xf] = auVar26[7];
    auVar93._14_2_ = auVar94._14_2_;
    auVar93._0_13_ = SUB1613(auVar39 << 0x20,0);
    auVar93[0xd] = auVar26[6];
    auVar17[8] = cVar10;
    auVar17._0_8_ = uVar2;
    auVar17._9_3_ = auVar93._13_3_;
    auVar92._12_4_ = auVar17._8_4_;
    auVar92._0_11_ = auVar88._0_11_;
    auVar92[0xb] = auVar26[5];
    auVar91._11_5_ = auVar92._11_5_;
    auVar91._0_10_ = auVar88._0_10_;
    auVar91[10] = cVar9;
    auVar90._10_6_ = auVar91._10_6_;
    auVar90._0_9_ = auVar88._0_9_;
    auVar90[9] = auVar26[4];
    auVar15[4] = cVar8;
    auVar15._0_4_ = uVar45;
    auVar15._5_7_ = auVar90._9_7_;
    auVar89._8_8_ = auVar15._4_8_;
    auVar89[7] = auVar26[3];
    auVar89[6] = cVar7;
    auVar89[5] = auVar26[2];
    auVar89[4] = cVar6;
    auVar89[3] = auVar26[1];
    auVar89[2] = cVar5;
    auVar89[1] = auVar26[0];
    auVar89[0] = cVar4;
    cVar4 = (0 < sVar49) * (sVar49 < 0x100) * (char)sVar49 - (0xff < sVar49);
    cVar5 = (0 < sVar65) * (sVar65 < 0x100) * (char)sVar65 - (0xff < sVar65);
    cVar6 = (0 < sVar66) * (sVar66 < 0x100) * (char)sVar66 - (0xff < sVar66);
    cVar7 = (0 < sVar67) * (sVar67 < 0x100) * (char)sVar67 - (0xff < sVar67);
    cVar8 = (0 < sVar68) * (sVar68 < 0x100) * (char)sVar68 - (0xff < sVar68);
    cVar9 = (0 < sVar69) * (sVar69 < 0x100) * (char)sVar69 - (0xff < sVar69);
    cVar10 = (0 < sVar70) * (sVar70 < 0x100) * (char)sVar70 - (0xff < sVar70);
    bVar12 = (0 < sVar71) * (sVar71 < 0x100) * (char)sVar71 - (0xff < sVar71);
    auVar64._0_14_ = ZEXT114(bVar12) << 0x38;
    auVar39 = pshufb(auVar73,auVar78);
    auVar78[0xe] = bVar12;
    auVar78._0_14_ = auVar64._0_14_;
    auVar78[0xf] = auVar39[7];
    auVar29._14_2_ = auVar78._14_2_;
    auVar29._0_13_ = ZEXT113(bVar12) << 0x38;
    auVar29[0xd] = auVar39[6];
    auVar28._13_3_ = auVar29._13_3_;
    auVar28._0_12_ = ZEXT112(bVar12) << 0x38;
    auVar28[0xc] = cVar10;
    auVar27._12_4_ = auVar28._12_4_;
    auVar27._0_11_ = ZEXT111(bVar12) << 0x38;
    auVar27[0xb] = auVar39[5];
    auVar95._11_5_ = auVar27._11_5_;
    auVar95._0_10_ = (unkuint10)bVar12 << 0x38;
    auVar95[10] = cVar9;
    auVar79._10_6_ = auVar95._10_6_;
    auVar79._0_9_ = (unkuint9)bVar12 << 0x38;
    auVar79[9] = auVar39[4];
    auVar74._8_8_ = (undefined8)(CONCAT72(auVar79._9_7_,CONCAT11(cVar8,bVar12)) >> 8);
    auVar74[7] = auVar39[3];
    auVar74[6] = cVar7;
    auVar74[5] = auVar39[2];
    auVar74[4] = cVar6;
    auVar74[3] = auVar39[1];
    auVar74[2] = cVar5;
    auVar74[1] = auVar39[0];
    auVar74[0] = cVar4;
    auVar64[0xe] = bVar12;
    auVar64[0xf] = (char)((ulong)uVar3 >> 0x38);
    auVar63._14_2_ = auVar64._14_2_;
    auVar63._0_13_ = ZEXT113(bVar12) << 0x38;
    auVar63[0xd] = (char)((ulong)uVar3 >> 0x30);
    auVar62._13_3_ = auVar63._13_3_;
    auVar62._0_12_ = ZEXT112(bVar12) << 0x38;
    auVar62[0xc] = cVar10;
    auVar61._12_4_ = auVar62._12_4_;
    auVar61._0_11_ = ZEXT111(bVar12) << 0x38;
    auVar61[0xb] = (char)((ulong)uVar3 >> 0x28);
    auVar60._11_5_ = auVar61._11_5_;
    auVar60._0_10_ = (unkuint10)bVar12 << 0x38;
    auVar60[10] = cVar9;
    auVar59._10_6_ = auVar60._10_6_;
    auVar59._0_9_ = (unkuint9)bVar12 << 0x38;
    auVar59[9] = (char)((ulong)uVar3 >> 0x20);
    auVar58._8_8_ = (undefined8)(CONCAT72(auVar59._9_7_,CONCAT11(cVar8,bVar12)) >> 8);
    auVar58[7] = (char)((ulong)uVar3 >> 0x18);
    auVar58[6] = cVar7;
    auVar58[5] = (char)((ulong)uVar3 >> 0x10);
    auVar58[4] = cVar6;
    auVar58[3] = (char)((ulong)uVar3 >> 8);
    auVar58[2] = cVar5;
    auVar58[1] = (char)uVar3;
    auVar58[0] = cVar4;
    auVar39 = pshufb(auVar58,_DAT_0016b4d0);
    *(long *)pu1_dst = auVar40._0_8_;
    *(long *)(pu1_dst + lVar21) = auVar89._0_8_;
    *(long *)(pu1_dst + lVar21 * 2) = auVar74._0_8_;
    *(long *)(pu1_dst + lVar21 * 3) = auVar39._0_8_;
  }
  else {
    iVar23 = 2 << ((byte)log2_trans_size & 0x1f);
    iVar22 = 0;
    auVar26 = pmovzxbw(in_XMM1,0xffffffffffffffff);
    for (; iVar22 < iVar24; iVar22 = iVar22 + 4) {
      lVar21 = 0;
      for (iVar25 = 0; iVar25 < iVar24; iVar25 = iVar25 + 8) {
        auVar78 = *(undefined1 (*) [16])(pu1_pred + lVar21) & auVar26;
        auVar79 = *(undefined1 (*) [16])(pu1_pred + lVar21 + pred_strd) & auVar26;
        auVar74 = *(undefined1 (*) [16])(pu1_pred + lVar21 + pred_strd * 2) & auVar26;
        auVar95 = *(undefined1 (*) [16])(pu1_pred + lVar21 + pred_strd * 3) & auVar26;
        sVar30 = auVar78._0_2_ + sVar70;
        sVar41 = auVar78._2_2_ + sVar71;
        sVar42 = auVar78._4_2_ + sVar70;
        sVar43 = auVar78._6_2_ + sVar71;
        sVar44 = auVar78._8_2_ + sVar70;
        sVar46 = auVar78._10_2_ + sVar71;
        sVar47 = auVar78._12_2_ + sVar70;
        sVar48 = auVar78._14_2_ + sVar71;
        sVar77 = auVar79._0_2_ + sVar70;
        sVar80 = auVar79._2_2_ + sVar71;
        sVar81 = auVar79._4_2_ + sVar70;
        sVar82 = auVar79._6_2_ + sVar71;
        sVar83 = auVar79._8_2_ + sVar70;
        sVar84 = auVar79._10_2_ + sVar71;
        sVar85 = auVar79._12_2_ + sVar70;
        sVar86 = auVar79._14_2_ + sVar71;
        sVar49 = auVar74._0_2_ + sVar70;
        sVar65 = auVar74._2_2_ + sVar71;
        sVar66 = auVar74._4_2_ + sVar70;
        sVar67 = auVar74._6_2_ + sVar71;
        sVar68 = auVar74._8_2_ + sVar70;
        sVar69 = auVar74._10_2_ + sVar71;
        sVar75 = auVar74._12_2_ + sVar70;
        sVar76 = auVar74._14_2_ + sVar71;
        sVar87 = auVar95._0_2_ + sVar70;
        sVar96 = auVar95._2_2_ + sVar71;
        sVar97 = auVar95._4_2_ + sVar70;
        sVar98 = auVar95._6_2_ + sVar71;
        sVar99 = auVar95._8_2_ + sVar70;
        sVar100 = auVar95._10_2_ + sVar71;
        sVar101 = auVar95._12_2_ + sVar70;
        sVar102 = auVar95._14_2_ + sVar71;
        auVar78 = pshufb(*(undefined1 (*) [16])(pu1_dst + lVar21),ZEXT816(0xf0d0b0907050301));
        auVar74 = pshufb(*(undefined1 (*) [16])(pu1_dst + lVar21 + dst_strd),auVar39);
        auVar79 = pshufb(*(undefined1 (*) [16])(pu1_dst + lVar21 + dst_strd * 2),
                         ZEXT816(0xf0d0b0907050301));
        auVar95 = pshufb(*(undefined1 (*) [16])(pu1_dst + lVar21 + dst_strd * 3),auVar39);
        pUVar1 = pu1_dst + lVar21;
        *pUVar1 = (0 < sVar30) * (sVar30 < 0x100) * (char)sVar30 - (0xff < sVar30);
        pUVar1[1] = auVar78[0];
        pUVar1[2] = (0 < sVar41) * (sVar41 < 0x100) * (char)sVar41 - (0xff < sVar41);
        pUVar1[3] = auVar78[1];
        pUVar1[4] = (0 < sVar42) * (sVar42 < 0x100) * (char)sVar42 - (0xff < sVar42);
        pUVar1[5] = auVar78[2];
        pUVar1[6] = (0 < sVar43) * (sVar43 < 0x100) * (char)sVar43 - (0xff < sVar43);
        pUVar1[7] = auVar78[3];
        pUVar1[8] = (0 < sVar44) * (sVar44 < 0x100) * (char)sVar44 - (0xff < sVar44);
        pUVar1[9] = auVar78[4];
        pUVar1[10] = (0 < sVar46) * (sVar46 < 0x100) * (char)sVar46 - (0xff < sVar46);
        pUVar1[0xb] = auVar78[5];
        pUVar1[0xc] = (0 < sVar47) * (sVar47 < 0x100) * (char)sVar47 - (0xff < sVar47);
        pUVar1[0xd] = auVar78[6];
        pUVar1[0xe] = (0 < sVar48) * (sVar48 < 0x100) * (char)sVar48 - (0xff < sVar48);
        pUVar1[0xf] = auVar78[7];
        pUVar1 = pu1_dst + lVar21 + dst_strd;
        *pUVar1 = (0 < sVar77) * (sVar77 < 0x100) * (char)sVar77 - (0xff < sVar77);
        pUVar1[1] = auVar74[8];
        pUVar1[2] = (0 < sVar80) * (sVar80 < 0x100) * (char)sVar80 - (0xff < sVar80);
        pUVar1[3] = auVar74[9];
        pUVar1[4] = (0 < sVar81) * (sVar81 < 0x100) * (char)sVar81 - (0xff < sVar81);
        pUVar1[5] = auVar74[10];
        pUVar1[6] = (0 < sVar82) * (sVar82 < 0x100) * (char)sVar82 - (0xff < sVar82);
        pUVar1[7] = auVar74[0xb];
        pUVar1[8] = (0 < sVar83) * (sVar83 < 0x100) * (char)sVar83 - (0xff < sVar83);
        pUVar1[9] = auVar74[0xc];
        pUVar1[10] = (0 < sVar84) * (sVar84 < 0x100) * (char)sVar84 - (0xff < sVar84);
        pUVar1[0xb] = auVar74[0xd];
        pUVar1[0xc] = (0 < sVar85) * (sVar85 < 0x100) * (char)sVar85 - (0xff < sVar85);
        pUVar1[0xd] = auVar74[0xe];
        pUVar1[0xe] = (0 < sVar86) * (sVar86 < 0x100) * (char)sVar86 - (0xff < sVar86);
        pUVar1[0xf] = auVar74[0xf];
        pUVar1 = pu1_dst + lVar21 + dst_strd * 2;
        *pUVar1 = (0 < sVar49) * (sVar49 < 0x100) * (char)sVar49 - (0xff < sVar49);
        pUVar1[1] = auVar79[0];
        pUVar1[2] = (0 < sVar65) * (sVar65 < 0x100) * (char)sVar65 - (0xff < sVar65);
        pUVar1[3] = auVar79[1];
        pUVar1[4] = (0 < sVar66) * (sVar66 < 0x100) * (char)sVar66 - (0xff < sVar66);
        pUVar1[5] = auVar79[2];
        pUVar1[6] = (0 < sVar67) * (sVar67 < 0x100) * (char)sVar67 - (0xff < sVar67);
        pUVar1[7] = auVar79[3];
        pUVar1[8] = (0 < sVar68) * (sVar68 < 0x100) * (char)sVar68 - (0xff < sVar68);
        pUVar1[9] = auVar79[4];
        pUVar1[10] = (0 < sVar69) * (sVar69 < 0x100) * (char)sVar69 - (0xff < sVar69);
        pUVar1[0xb] = auVar79[5];
        pUVar1[0xc] = (0 < sVar75) * (sVar75 < 0x100) * (char)sVar75 - (0xff < sVar75);
        pUVar1[0xd] = auVar79[6];
        pUVar1[0xe] = (0 < sVar76) * (sVar76 < 0x100) * (char)sVar76 - (0xff < sVar76);
        pUVar1[0xf] = auVar79[7];
        pUVar1 = pu1_dst + lVar21 + dst_strd * 3;
        *pUVar1 = (0 < sVar87) * (sVar87 < 0x100) * (char)sVar87 - (0xff < sVar87);
        pUVar1[1] = auVar95[8];
        pUVar1[2] = (0 < sVar96) * (sVar96 < 0x100) * (char)sVar96 - (0xff < sVar96);
        pUVar1[3] = auVar95[9];
        pUVar1[4] = (0 < sVar97) * (sVar97 < 0x100) * (char)sVar97 - (0xff < sVar97);
        pUVar1[5] = auVar95[10];
        pUVar1[6] = (0 < sVar98) * (sVar98 < 0x100) * (char)sVar98 - (0xff < sVar98);
        pUVar1[7] = auVar95[0xb];
        pUVar1[8] = (0 < sVar99) * (sVar99 < 0x100) * (char)sVar99 - (0xff < sVar99);
        pUVar1[9] = auVar95[0xc];
        pUVar1[10] = (0 < sVar100) * (sVar100 < 0x100) * (char)sVar100 - (0xff < sVar100);
        pUVar1[0xb] = auVar95[0xd];
        pUVar1[0xc] = (0 < sVar101) * (sVar101 < 0x100) * (char)sVar101 - (0xff < sVar101);
        pUVar1[0xd] = auVar95[0xe];
        pUVar1[0xe] = (0 < sVar102) * (sVar102 < 0x100) * (char)sVar102 - (0xff < sVar102);
        pUVar1[0xf] = auVar95[0xf];
        lVar21 = lVar21 + 0x10;
      }
      pu1_pred = pu1_pred + lVar21 + (pred_strd * 4 - iVar23);
      pu1_dst = pu1_dst + lVar21 + (dst_strd * 4 - iVar23);
    }
  }
  return;
}

Assistant:

void ihevcd_itrans_recon_dc_chroma_ssse3(UWORD8 *pu1_pred, UWORD8 *pu1_dst, WORD32 pred_strd, WORD32 dst_strd,
                                         WORD32 log2_trans_size, WORD16 i2_coeff_value)
{
    __m128i m_temp_reg_0;
    __m128i m_temp_reg_1;
    __m128i m_temp_reg_2;
    __m128i m_temp_reg_3;
    __m128i m_temp_reg_4;
    __m128i m_temp_reg_5;
    __m128i m_temp_reg_6;
    __m128i m_temp_reg_7;
    __m128i m_temp_reg_8;
    __m128i m_temp_reg_9;
    __m128i m_temp_reg_10;
    __m128i m_temp_reg_11;
    __m128i m_temp_reg_12;
    __m128i m_temp_reg_13;
    __m128i m_temp_reg_14;
    __m128i m_temp_reg_15;
    __m128i m_temp_reg_20, zero_8x16b;
    __m128i *pi4_dst = (__m128i *)pu1_dst;


    WORD32 add, shift;
    WORD32 dc_value, quant_out;
    WORD32 trans_size;


    WORD32 shuffle_mask_4x4 = 0x06040200;
    WORD32 unchanged_mask_4x4 = 0x07050301;
    LWORD64 shuffle_mask = 0x0E0C0A0806040200LL;
    LWORD64 unchanged_mask = 0x0F0D0B0907050301LL;

    trans_size = (1 << log2_trans_size);

    quant_out = i2_coeff_value;

    shift = IT_SHIFT_STAGE_1;
    add = 1 << (shift - 1);
    dc_value = CLIP_S16((quant_out * 64 + add) >> shift);
    shift = IT_SHIFT_STAGE_2;
    add = 1 << (shift - 1);
    dc_value = CLIP_S16((dc_value * 64 + add) >> shift);

    /*Replicate the DC value within 16 bits in 128 bit register*/
    m_temp_reg_20 = _mm_set1_epi16(dc_value);
    zero_8x16b = _mm_setzero_si128();

    if(trans_size == 4)
    {
        __m128i chroma_shuffle_mask_16x8b;
        __m128i chroma_unchanged_mask_16x8b;
        chroma_shuffle_mask_16x8b = _mm_cvtsi32_si128(shuffle_mask_4x4);
        chroma_unchanged_mask_16x8b = _mm_cvtsi32_si128(unchanged_mask_4x4);

        /*Load the prediction data*/
        m_temp_reg_0 = _mm_loadl_epi64((__m128i *)(pu1_pred));
        m_temp_reg_1 = _mm_loadl_epi64((__m128i *)(pu1_pred + pred_strd));
        m_temp_reg_2 = _mm_loadl_epi64((__m128i *)(pu1_pred + 2 * pred_strd));
        m_temp_reg_3 = _mm_loadl_epi64((__m128i *)(pu1_pred + 3 * pred_strd));

        m_temp_reg_10  = _mm_shuffle_epi8(m_temp_reg_0, chroma_shuffle_mask_16x8b);
        m_temp_reg_11  = _mm_shuffle_epi8(m_temp_reg_1, chroma_shuffle_mask_16x8b);
        m_temp_reg_12  = _mm_shuffle_epi8(m_temp_reg_2, chroma_shuffle_mask_16x8b);
        m_temp_reg_13  = _mm_shuffle_epi8(m_temp_reg_3, chroma_shuffle_mask_16x8b);

        m_temp_reg_14 = _mm_unpacklo_epi32(m_temp_reg_10, m_temp_reg_11);
        m_temp_reg_15 = _mm_unpacklo_epi32(m_temp_reg_12, m_temp_reg_13);

        m_temp_reg_4 = _mm_unpacklo_epi8(m_temp_reg_14, zero_8x16b);
        m_temp_reg_5 = _mm_unpacklo_epi8(m_temp_reg_15, zero_8x16b);

        m_temp_reg_6 = _mm_add_epi16(m_temp_reg_4, m_temp_reg_20);
        m_temp_reg_7 = _mm_add_epi16(m_temp_reg_5, m_temp_reg_20);

        /*Load the recon data to make sure that 'v' is not corrupted when 'u' is called and vice versa*/
        m_temp_reg_0 = _mm_loadl_epi64((__m128i *)pu1_dst);
        m_temp_reg_1 = _mm_loadl_epi64((__m128i *)(pu1_dst + dst_strd));
        m_temp_reg_2 = _mm_loadl_epi64((__m128i *)(pu1_dst + 2 * dst_strd));
        m_temp_reg_3 = _mm_loadl_epi64((__m128i *)(pu1_dst + 3 * dst_strd));

        m_temp_reg_0  = _mm_shuffle_epi8(m_temp_reg_0, chroma_unchanged_mask_16x8b);
        m_temp_reg_1  = _mm_shuffle_epi8(m_temp_reg_1, chroma_unchanged_mask_16x8b);
        m_temp_reg_2  = _mm_shuffle_epi8(m_temp_reg_2, chroma_unchanged_mask_16x8b);
        m_temp_reg_3  = _mm_shuffle_epi8(m_temp_reg_3, chroma_unchanged_mask_16x8b);


        m_temp_reg_8 = _mm_packus_epi16(m_temp_reg_6, m_temp_reg_7);
        m_temp_reg_9 = _mm_unpacklo_epi8(m_temp_reg_8, m_temp_reg_0);
        m_temp_reg_8 = _mm_srli_si128(m_temp_reg_8, 4);
        m_temp_reg_10 = _mm_unpacklo_epi8(m_temp_reg_8, m_temp_reg_1);
        m_temp_reg_8 = _mm_srli_si128(m_temp_reg_8, 4);
        m_temp_reg_11 = _mm_unpacklo_epi8(m_temp_reg_8, m_temp_reg_2);
        m_temp_reg_8 = _mm_srli_si128(m_temp_reg_8, 4);
        m_temp_reg_12 = _mm_unpacklo_epi8(m_temp_reg_8, m_temp_reg_3);

        /*Store the result in the destination*/
        _mm_storel_epi64(pi4_dst, m_temp_reg_9);
        pu1_dst += dst_strd;
        pi4_dst = (__m128i *)(pu1_dst);


        _mm_storel_epi64(pi4_dst, m_temp_reg_10);
        pu1_dst += dst_strd;
        pi4_dst = (__m128i *)(pu1_dst);

        _mm_storel_epi64(pi4_dst, m_temp_reg_11);
        pu1_dst += dst_strd;
        pi4_dst = (__m128i *)(pu1_dst);

        _mm_storel_epi64(pi4_dst, m_temp_reg_12);
    }
    else
    {
        WORD32 i, j;
        __m128i chroma_shuffle_mask_16x8b;
        __m128i chroma_unchanged_mask_16x8b;
        chroma_shuffle_mask_16x8b = _mm_loadl_epi64((__m128i *)(&shuffle_mask));
        chroma_unchanged_mask_16x8b =
                        _mm_loadl_epi64((__m128i *)(&unchanged_mask));

        for(i = 0; i < trans_size; i += 4)
        {
            for(j = 0; j < trans_size; j += 8)
            {

                m_temp_reg_0 = _mm_loadu_si128((__m128i *)pu1_pred);
                m_temp_reg_1 = _mm_loadu_si128((__m128i *)(pu1_pred + pred_strd));
                m_temp_reg_2 = _mm_loadu_si128((__m128i *)(pu1_pred + 2 * pred_strd));
                m_temp_reg_3 = _mm_loadu_si128((__m128i *)(pu1_pred + 3 * pred_strd));

                /*Retain only one chroma component*/
                m_temp_reg_4  = _mm_shuffle_epi8(m_temp_reg_0, chroma_shuffle_mask_16x8b);
                m_temp_reg_5  = _mm_shuffle_epi8(m_temp_reg_1, chroma_shuffle_mask_16x8b);
                m_temp_reg_6  = _mm_shuffle_epi8(m_temp_reg_2, chroma_shuffle_mask_16x8b);
                m_temp_reg_7  = _mm_shuffle_epi8(m_temp_reg_3, chroma_shuffle_mask_16x8b);

                m_temp_reg_4 = _mm_unpacklo_epi8(m_temp_reg_4, zero_8x16b);
                m_temp_reg_5 = _mm_unpacklo_epi8(m_temp_reg_5, zero_8x16b);
                m_temp_reg_6 = _mm_unpacklo_epi8(m_temp_reg_6, zero_8x16b);
                m_temp_reg_7 = _mm_unpacklo_epi8(m_temp_reg_7, zero_8x16b);

                m_temp_reg_8 = _mm_add_epi16(m_temp_reg_4, m_temp_reg_20);
                m_temp_reg_9 = _mm_add_epi16(m_temp_reg_5, m_temp_reg_20);
                m_temp_reg_10 = _mm_add_epi16(m_temp_reg_6, m_temp_reg_20);
                m_temp_reg_11 = _mm_add_epi16(m_temp_reg_7, m_temp_reg_20);


                /*Load the recon data to make sure that 'v' is not corrupted when 'u' is called and vice versa*/
                m_temp_reg_0 = _mm_loadu_si128((__m128i *)pu1_dst);
                m_temp_reg_1 = _mm_loadu_si128((__m128i *)(pu1_dst + dst_strd));
                m_temp_reg_2 = _mm_loadu_si128((__m128i *)(pu1_dst + 2 * dst_strd));
                m_temp_reg_3 = _mm_loadu_si128((__m128i *)(pu1_dst + 3 * dst_strd));

                m_temp_reg_0  = _mm_shuffle_epi8(m_temp_reg_0, chroma_unchanged_mask_16x8b);
                m_temp_reg_1  = _mm_shuffle_epi8(m_temp_reg_1, chroma_unchanged_mask_16x8b);
                m_temp_reg_2  = _mm_shuffle_epi8(m_temp_reg_2, chroma_unchanged_mask_16x8b);
                m_temp_reg_3  = _mm_shuffle_epi8(m_temp_reg_3, chroma_unchanged_mask_16x8b);

                m_temp_reg_4 = _mm_packus_epi16(m_temp_reg_8, m_temp_reg_9);
                m_temp_reg_5 = _mm_packus_epi16(m_temp_reg_10, m_temp_reg_11);

                m_temp_reg_12 = _mm_unpacklo_epi8(m_temp_reg_4, m_temp_reg_0);
                m_temp_reg_4 = _mm_srli_si128(m_temp_reg_4, 8);
                m_temp_reg_13 = _mm_unpacklo_epi8(m_temp_reg_4, m_temp_reg_1);

                m_temp_reg_14 = _mm_unpacklo_epi8(m_temp_reg_5, m_temp_reg_2);
                m_temp_reg_5 = _mm_srli_si128(m_temp_reg_5, 8);
                m_temp_reg_15 = _mm_unpacklo_epi8(m_temp_reg_5, m_temp_reg_3);

                /*Store the result in the destination*/
                pi4_dst = (__m128i *)(pu1_dst);

                _mm_storel_epi64(pi4_dst, m_temp_reg_12);
                m_temp_reg_8 = _mm_srli_si128(m_temp_reg_12, 8);

                pi4_dst = (__m128i *)(pu1_dst + 8);
                _mm_storel_epi64(pi4_dst, m_temp_reg_8);

                pi4_dst = (__m128i *)(pu1_dst + dst_strd);

                _mm_storel_epi64(pi4_dst, m_temp_reg_13);
                m_temp_reg_9 = _mm_srli_si128(m_temp_reg_13, 8);

                pi4_dst = (__m128i *)(pu1_dst + dst_strd + 8);
                _mm_storel_epi64(pi4_dst, m_temp_reg_9);

                pi4_dst = (__m128i *)(pu1_dst + 2 * dst_strd);

                _mm_storel_epi64(pi4_dst, m_temp_reg_14);
                m_temp_reg_10 = _mm_srli_si128(m_temp_reg_14, 8);

                pi4_dst = (__m128i *)(pu1_dst + 2 * dst_strd + 8);
                _mm_storel_epi64(pi4_dst, m_temp_reg_10);

                pi4_dst = (__m128i *)(pu1_dst + 3 * dst_strd);

                _mm_storel_epi64(pi4_dst, m_temp_reg_15);
                m_temp_reg_11 = _mm_srli_si128(m_temp_reg_15, 8);

                pi4_dst = (__m128i *)(pu1_dst + 3 * dst_strd + 8);
                _mm_storel_epi64(pi4_dst, m_temp_reg_11);

                pu1_pred += 16;
                pu1_dst += 16;
            }

            pu1_pred += 4 * pred_strd - 2 * trans_size;
            pu1_dst += 4 * dst_strd - 2 * trans_size;
        }
    }


}